

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::generate_parents
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *section,string *name,char parentSeparator)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pbVar6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar7;
  string *s;
  int iVar8;
  void *pvVar9;
  size_type sVar10;
  pointer pcVar11;
  size_t sVar12;
  char *__data;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  pointer local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar11 = (section->_M_dataplus)._M_p;
  local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  local_70 = &local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar11,pcVar11 + section->_M_string_length);
  local_50 = name;
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_70,local_70->_M_local_buf + (long)&local_68->_M_dataplus,local_70);
  paVar2 = &local_98.field_2;
  if (local_70 == &local_60) {
    local_98.field_2._8_8_ = local_60._8_8_;
    local_98._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_70;
  }
  local_98.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_98.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_98._M_string_length = (size_type)local_68;
  local_68 = (pointer)0x0;
  local_60._M_local_buf[0] = '\0';
  local_70 = &local_60;
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"default");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,(size_t)(local_98.field_2._M_allocated_capacity + 1));
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                             + 1);
  }
  if (iVar8 != 0) {
    pcVar11 = (section->_M_dataplus)._M_p;
    sVar12 = section->_M_string_length;
    if (sVar12 != 0) {
      pvVar9 = memchr(pcVar11,(int)parentSeparator,sVar12);
      if ((long)pvVar9 - (long)pcVar11 != -1 && pvVar9 != (void *)0x0) {
        split(&local_48,section,parentSeparator);
        local_98.field_2._M_allocated_capacity = *(undefined8 *)(local_78 + 0x10);
        *(pointer *)(local_78 + 0x10) =
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98._M_dataplus._M_p = *(pointer *)local_78;
        local_98._M_string_length = *(size_type *)(local_78 + 8);
        *(pointer *)local_78 =
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)(local_78 + 8) =
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        goto LAB_00177a3f;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar11,pcVar11 + sVar12);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>(local_78,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,(size_t)(local_98.field_2._M_allocated_capacity + 1)
                     );
    }
  }
LAB_00177a3f:
  s = local_50;
  pvVar7 = local_78;
  if (local_50->_M_string_length != 0) {
    pcVar11 = (local_50->_M_dataplus)._M_p;
    pvVar9 = memchr(pcVar11,(int)parentSeparator,local_50->_M_string_length);
    if ((long)pvVar9 - (long)pcVar11 != -1 && pvVar9 != (void *)0x0) {
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_98,s,parentSeparator);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_98._M_string_length + -0x20));
      if (1 < s->_M_string_length) {
        pcVar4 = (s->_M_dataplus)._M_p;
        cVar3 = *pcVar4;
        if (((cVar3 == '\'') || (cVar3 == '\"')) && (cVar3 == pcVar4[s->_M_string_length - 1])) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                    (s);
          if (s->_M_string_length == 1) {
            pcVar11 = (s->_M_dataplus)._M_p;
            s->_M_string_length = 0;
          }
          else {
            sVar12 = s->_M_string_length - 1;
            pcVar11 = (s->_M_dataplus)._M_p;
            if (sVar12 == 1) {
              *pcVar11 = pcVar11[1];
            }
            else {
              memmove(pcVar11,pcVar11 + 1,sVar12);
            }
            sVar10 = s->_M_string_length - 1;
            s->_M_string_length = sVar10;
            pcVar11 = (s->_M_dataplus)._M_p + sVar10;
          }
          *pcVar11 = '\0';
        }
      }
      pbVar1 = (pointer)(local_98._M_string_length + -0x20);
      pcVar11 = (((pointer)(local_98._M_string_length + -0x20))->_M_dataplus)._M_p;
      pbVar6 = (pointer)(local_98._M_string_length + -0x20);
      local_98._M_string_length = (size_type)pbVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar11 != &pbVar6->field_2) {
        operator_delete(pcVar11,(pbVar6->field_2)._M_allocated_capacity + 1);
      }
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (pvVar7,*(undefined8 *)(pvVar7 + 8),local_98._M_dataplus._M_p,
                 local_98._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
    }
  }
  pbVar5 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pvVar7 + 8);
  for (this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pvVar7;
      this != pbVar5; this = this + 1) {
    if (1 < this->_M_string_length) {
      pcVar4 = (this->_M_dataplus)._M_p;
      cVar3 = *pcVar4;
      if (((cVar3 == '\'') || (cVar3 == '\"')) && (cVar3 == pcVar4[this->_M_string_length - 1])) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (this);
        if (this->_M_string_length == 1) {
          pcVar11 = (this->_M_dataplus)._M_p;
          this->_M_string_length = 0;
        }
        else {
          sVar12 = this->_M_string_length - 1;
          pcVar11 = (this->_M_dataplus)._M_p;
          if (sVar12 == 1) {
            *pcVar11 = pcVar11[1];
          }
          else {
            memmove(pcVar11,pcVar11 + 1,sVar12);
          }
          sVar10 = this->_M_string_length - 1;
          this->_M_string_length = sVar10;
          pcVar11 = (this->_M_dataplus)._M_p + sVar10;
        }
        *pcVar11 = '\0';
      }
    }
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)pvVar7;
}

Assistant:

inline std::vector<std::string> generate_parents(const std::string &section, std::string &name, char parentSeparator) {
    std::vector<std::string> parents;
    if(detail::to_lower(section) != "default") {
        if(section.find(parentSeparator) != std::string::npos) {
            parents = detail::split(section, parentSeparator);
        } else {
            parents = {section};
        }
    }
    if(name.find(parentSeparator) != std::string::npos) {
        std::vector<std::string> plist = detail::split(name, parentSeparator);
        name = plist.back();
        detail::remove_quotes(name);
        plist.pop_back();
        parents.insert(parents.end(), plist.begin(), plist.end());
    }

    // clean up quotes on the parents
    for(auto &parent : parents) {
        detail::remove_quotes(parent);
    }
    return parents;
}